

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O3

void __thiscall
charls::process_transformed<charls::transform_hp2<unsigned_char>_>::process_transformed
          (process_transformed<charls::transform_hp2<unsigned_char>_> *this,uint8_t *param_2,
          size_t param_3,size_t stride,frame_info *info,coding_parameters *parameters)

{
  allocator_type local_2a;
  allocator_type local_29;
  
  (this->super_process_line)._vptr_process_line = (_func_int **)&PTR__process_transformed_00140478;
  this->frame_info_ = info;
  this->parameters_ = parameters;
  this->stride_ = stride;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->temp_line_,(ulong)info->width * (long)info->component_count,&local_29);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->buffer_,(ulong)info->width * (long)info->component_count,&local_2a);
  (this->raw_pixels_).data = param_2;
  (this->raw_pixels_).size = param_3;
  this->mask_ = ~(-1 << ((byte)info->bits_per_sample & 0x1f));
  return;
}

Assistant:

process_transformed(byte_span source_pixels, const size_t stride, const frame_info& info,
                        const coding_parameters& parameters, TransformType transform) :
        frame_info_{info},
        parameters_{parameters},
        stride_{stride},
        temp_line_(static_cast<size_t>(info.component_count) * info.width),
        buffer_(static_cast<size_t>(info.component_count) * info.width * sizeof(size_type)),
        transform_{transform},
        inverse_transform_{transform},
        raw_pixels_{source_pixels},
        mask_{(1U << info.bits_per_sample) - 1U}
    {
    }